

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlMaster.cpp
# Opt level: O2

EbmlElement * __thiscall
libebml::EbmlMaster::FindFirstElt(EbmlMaster *this,EbmlCallbacks *Callbacks)

{
  pointer ppEVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar3;
  
  uVar3 = 0;
  while( true ) {
    ppEVar1 = (this->ElementList).
              super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->ElementList).
                      super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar1 >> 3) <= uVar3) {
      return (EbmlElement *)0x0;
    }
    iVar2 = (*ppEVar1[uVar3]->_vptr_EbmlElement[3])();
    if ((Callbacks->GlobalId->Length == *(size_t *)((uint32 *)CONCAT44(extraout_var,iVar2) + 2)) &&
       (Callbacks->GlobalId->Value == *(uint32 *)CONCAT44(extraout_var,iVar2))) break;
    uVar3 = uVar3 + 1;
  }
  return (this->ElementList).
         super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>._M_impl
         .super__Vector_impl_data._M_start[uVar3];
}

Assistant:

EbmlElement *EbmlMaster::FindFirstElt(const EbmlCallbacks & Callbacks) const
{
  size_t Index;

  for (Index = 0; Index < ElementList.size(); Index++) {
    if (EbmlId(*(ElementList[Index])) == EBML_INFO_ID(Callbacks))
      return ElementList[Index];
  }

  return NULL;
}